

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_helpers.cpp
# Opt level: O0

string * underscore_to_camel_case(string *__return_storage_ptr__,string *s)

{
  long lVar1;
  char *pcVar2;
  byte *pbVar3;
  size_t end;
  size_t i;
  string *s_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  end = 0;
  lVar1 = std::__cxx11::string::size();
  for (; end < lVar1 - 1U; end = end + 1) {
    pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
    if (*pcVar2 == '_') {
      pbVar3 = (byte *)std::__cxx11::string::operator[]((ulong)s);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pbVar3 ^ 0x20);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)s);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,*pcVar2);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string underscore_to_camel_case(const std::string &s) {
  std::string ret;
  for (size_t i = 0, end = s.size() - 1; i < end; ++i) {
    if (s[i] == '_') {
      ret += s[i + 1] ^ 32;
      continue;
    }
    ret += s[i];
  }
  return ret;
}